

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::setR5EncryptionParameters
          (QPDFWriter *this,char *user_password,char *owner_password,bool allow_accessibility,
          bool allow_extract,bool allow_assemble,bool allow_annotate_and_form,
          bool allow_form_filling,bool allow_modify_other,qpdf_r3_print_e print,
          bool encrypt_metadata)

{
  byte bVar1;
  element_type *peVar2;
  undefined1 local_70 [8];
  set<int,_std::less<int>,_std::allocator<int>_> clear;
  bool encrypt_metadata_local;
  bool allow_modify_other_local;
  bool allow_form_filling_local;
  bool allow_annotate_and_form_local;
  bool allow_assemble_local;
  bool allow_extract_local;
  bool allow_accessibility_local;
  char *owner_password_local;
  char *user_password_local;
  QPDFWriter *this_local;
  
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = allow_annotate_and_form;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = allow_form_filling;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ = allow_modify_other;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = encrypt_metadata;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = allow_assemble;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = allow_extract;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = allow_accessibility;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
  interpretR3EncryptionParameters
            (this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_70,user_password,
             owner_password,(bool)(clear._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1)
             ,(bool)(clear._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1),
             (bool)(clear._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1),
             (bool)(clear._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ & 1),
             (bool)(clear._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1),
             (bool)(clear._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1),print,
             qpdf_r3m_all);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = clear._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_;
  peVar2->encrypt_use_aes = true;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2->encrypt_metadata = (bool)(bVar1 & 1);
  setEncryptionParameters
            (this,user_password,owner_password,5,5,0x20,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
  return;
}

Assistant:

void
QPDFWriter::setR5EncryptionParameters(
    char const* user_password,
    char const* owner_password,
    bool allow_accessibility,
    bool allow_extract,
    bool allow_assemble,
    bool allow_annotate_and_form,
    bool allow_form_filling,
    bool allow_modify_other,
    qpdf_r3_print_e print,
    bool encrypt_metadata)
{
    std::set<int> clear;
    interpretR3EncryptionParameters(
        clear,
        user_password,
        owner_password,
        allow_accessibility,
        allow_extract,
        allow_assemble,
        allow_annotate_and_form,
        allow_form_filling,
        allow_modify_other,
        print,
        qpdf_r3m_all);
    m->encrypt_use_aes = true;
    m->encrypt_metadata = encrypt_metadata;
    setEncryptionParameters(user_password, owner_password, 5, 5, 32, clear);
}